

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSwitchEncodingName(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  char *val_00;
  int local_34;
  int n_encoding;
  char *encoding;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (encoding._4_4_ = 0; (int)encoding._4_4_ < 3; encoding._4_4_ = encoding._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(encoding._4_4_,0);
      val_00 = gen_const_char_ptr(local_34,1);
      iVar2 = xmlSwitchEncodingName(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(encoding._4_4_,val,0);
      des_const_char_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncodingName",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)encoding._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSwitchEncodingName(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserCtxtPtr ctxt; /* the parser context */
    int n_ctxt;
    const char * encoding; /* the encoding name */
    int n_encoding;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        encoding = gen_const_char_ptr(n_encoding, 1);

        ret_val = xmlSwitchEncodingName(ctxt, encoding);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_char_ptr(n_encoding, encoding, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSwitchEncodingName",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_encoding);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}